

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O0

string * __thiscall
Catch::StringMaker<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>::
convert_abi_cxx11_(string *__return_storage_ptr__,void *this,wstring_view str)

{
  allocator<wchar_t> local_41;
  wstring local_40;
  undefined1 local_20 [8];
  wstring_view str_local;
  
  str_local._M_len = str._M_len;
  local_20 = (undefined1  [8])this;
  str_local._M_str = (wchar_t *)__return_storage_ptr__;
  std::allocator<wchar_t>::allocator();
  std::__cxx11::wstring::wstring<std::basic_string_view<wchar_t,std::char_traits<wchar_t>>,void>
            ((wstring *)&local_40,(basic_string_view<wchar_t,_std::char_traits<wchar_t>_> *)local_20
             ,&local_41);
  StringMaker<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_void>
  ::convert(__return_storage_ptr__,&local_40);
  std::__cxx11::wstring::~wstring((wstring *)&local_40);
  std::allocator<wchar_t>::~allocator(&local_41);
  return __return_storage_ptr__;
}

Assistant:

std::string StringMaker<std::wstring_view>::convert(std::wstring_view str) {
        return StringMaker<std::wstring>::convert(std::wstring(str));
    }